

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplePursuit.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_73edc::MpPlugIn::~MpPlugIn(MpPlugIn *this)

{
  pointer ppMVar1;
  
  (this->super_PlugIn).super_AbstractPlugIn._vptr_AbstractPlugIn =
       (_func_int **)&PTR__MpPlugIn_00178460;
  ppMVar1 = (this->allMP).
            super__Vector_base<(anonymous_namespace)::MpBase_*,_std::allocator<(anonymous_namespace)::MpBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar1 != (pointer)0x0) {
    operator_delete(ppMVar1,(long)(this->allMP).
                                  super__Vector_base<(anonymous_namespace)::MpBase_*,_std::allocator<(anonymous_namespace)::MpBase_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppMVar1
                   );
  }
  OpenSteer::PlugIn::~PlugIn(&this->super_PlugIn);
  return;
}

Assistant:

void open (void)
        {
            // create the wanderer, saving a pointer to it
            wanderer = new MpWanderer;
            allMP.push_back (wanderer);

            // create the specified number of pursuers, save pointers to them
            const int pursuerCount = 30;
            for (int i = 0; i < pursuerCount; i++)
                allMP.push_back (new MpPursuer (wanderer));
            pBegin = allMP.begin() + 1;  // iterator pointing to first pursuer
            pEnd = allMP.end();          // iterator pointing to last pursuer

            // initialize camera
            OpenSteerDemo::selectedVehicle = wanderer;
            OpenSteerDemo::camera.mode = Camera::cmStraightDown;
            OpenSteerDemo::camera.fixedDistDistance = OpenSteerDemo::cameraTargetDistance;
            OpenSteerDemo::camera.fixedDistVOffset = OpenSteerDemo::camera2dElevation;
        }